

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O3

int ShouldMergeBlock(BrotliOnePassArena *s,uint8_t *data,size_t len,uint8_t *depths)

{
  byte bVar1;
  ulong uVar2;
  uint32_t *__s;
  long lVar3;
  double dVar4;
  double dVar5;
  
  __s = s->histogram;
  uVar2 = 0;
  switchD_012e3010::default(__s,0,0x400);
  if (len != 0) {
    uVar2 = 0;
    do {
      __s[data[uVar2]] = __s[data[uVar2]] + 1;
      uVar2 = uVar2 + 0x2b;
    } while (uVar2 < len);
    uVar2 = (len + 0x2a) / 0x2b;
    if (0x2aff < len + 0x2a) {
      dVar4 = (double)uVar2;
      dVar5 = log2(dVar4);
      goto LAB_01d1c514;
    }
  }
  dVar5 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar2];
  dVar4 = (double)uVar2;
LAB_01d1c514:
  dVar5 = (dVar5 + 0.5) * dVar4 + 200.0;
  lVar3 = 0;
  do {
    uVar2 = (ulong)__s[lVar3];
    bVar1 = depths[lVar3];
    if (uVar2 < 0x100) {
      dVar4 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar2];
    }
    else {
      dVar4 = log2((double)uVar2);
    }
    dVar5 = dVar5 - (double)uVar2 * ((double)bVar1 + dVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return (int)(0.0 <= dVar5);
}

Assistant:

static BROTLI_BOOL ShouldMergeBlock(BrotliOnePassArena* s,
    const uint8_t* data, size_t len, const uint8_t* depths) {
  uint32_t* BROTLI_RESTRICT const histo = s->histogram;
  static const size_t kSampleRate = 43;
  size_t i;
  memset(histo, 0, sizeof(s->histogram));
  for (i = 0; i < len; i += kSampleRate) {
    ++histo[data[i]];
  }
  {
    const size_t total = (len + kSampleRate - 1) / kSampleRate;
    double r = (FastLog2(total) + 0.5) * (double)total + 200;
    for (i = 0; i < 256; ++i) {
      r -= (double)histo[i] * (depths[i] + FastLog2(histo[i]));
    }
    return TO_BROTLI_BOOL(r >= 0.0);
  }
}